

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O3

IssuanceParameter * __thiscall
cfd::core::ConfidentialTransaction::SetAssetIssuance
          (IssuanceParameter *__return_storage_ptr__,ConfidentialTransaction *this,
          uint32_t tx_in_index,Amount *asset_amount,
          vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *asset_output_amount_list,
          vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *asset_locking_script_list,
          vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
          *asset_nonce_list,Amount *token_amount,
          vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *token_output_amount_list,
          vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *token_locking_script_list,
          vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
          *token_nonce_list,bool is_blind,ByteData256 *contract_hash)

{
  pointer pAVar1;
  pointer pAVar2;
  Amount *pAVar3;
  Script *pSVar4;
  pointer pCVar5;
  ByteData issuance_amount_rangeproof;
  ByteData inflation_keys_rangeproof;
  uint32_t vout;
  pointer __dest;
  size_t sVar6;
  pointer puVar7;
  int64_t iVar8;
  CfdException *pCVar9;
  Amount *amount;
  size_t sVar10;
  Amount *pAVar11;
  Script *pSVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  bool bVar17;
  ConfidentialNonce nonce;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *__range3;
  Amount total;
  pointer local_130;
  ByteData local_118;
  ByteData local_f8;
  ByteData256 local_e0;
  ByteData256 local_c8;
  ConfidentialValue local_b0;
  ConfidentialValue local_88;
  ByteData local_60;
  ByteData local_48;
  
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xb])
            (this,(ulong)tx_in_index,0x750,"SetAssetIssuance");
  ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)&nonce,
             &(this->vin_).
              super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
              ._M_impl.super__Vector_impl_data._M_start[tx_in_index].inflation_keys_);
  puVar7 = (pointer)CONCAT44(nonce.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,
                             nonce.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._0_4_);
  local_f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar15 = (long)nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)puVar7;
  if (uVar15 == 0) {
    __dest = (pointer)0x0;
    sVar10 = 0;
  }
  else {
    if ((long)uVar15 < 0) {
      ::std::__throw_bad_alloc();
    }
    __dest = (pointer)operator_new(uVar15);
    puVar7 = (pointer)CONCAT44(nonce.data_.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,
                               nonce.data_.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_4_);
    sVar10 = (long)nonce.data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)puVar7;
  }
  local_f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = __dest + uVar15;
  local_f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = __dest;
  if (nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar7) {
    local_f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = __dest;
    memmove(__dest,puVar7,sVar10);
  }
  local_f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = __dest + sVar10;
  sVar6 = ByteData::GetDataSize(&local_f8);
  bVar17 = true;
  if (sVar6 == 0) {
    ConfidentialValue::ConfidentialValue
              ((ConfidentialValue *)&total,
               &(this->vin_).
                super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
                ._M_impl.super__Vector_impl_data._M_start[tx_in_index].issuance_amount_);
    local_118.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_118.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_118.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar15 = (long)local_130 - total._8_8_;
    if (uVar15 == 0) {
      puVar7 = (pointer)0x0;
      sVar10 = 0;
    }
    else {
      if ((long)uVar15 < 0) {
        ::std::__throw_bad_alloc();
      }
      puVar7 = (pointer)operator_new(uVar15);
      sVar10 = (long)local_130 - total._8_8_;
    }
    local_118.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puVar7 + uVar15;
    local_118.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = puVar7;
    if (local_130 != (pointer)total._8_8_) {
      local_118.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar7;
      memmove(puVar7,(void *)total._8_8_,sVar10);
    }
    local_118.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar7 + sVar10;
    sVar6 = ByteData::GetDataSize(&local_118);
    bVar17 = sVar6 != 0;
    if (local_118.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_118.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    total.amount_ = (int64_t)&PTR__ConfidentialValue_0068d0c0;
    if (total._8_8_ != 0) {
      operator_delete((void *)total._8_8_);
    }
  }
  if (local_f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  nonce._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialValue_0068d0c0;
  if ((void *)CONCAT44(nonce.data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       nonce.data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(nonce.data_.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     nonce.data_.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_4_));
  }
  if (bVar17) {
    nonce._vptr_ConfidentialNonce = (_func_int **)0x5893e8;
    nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x754;
    nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "SetAssetIssuance";
    logger::log<>((CfdSourceLocation *)&nonce,kCfdLogLevelWarning,"already set to issue parameter");
    pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
    nonce._vptr_ConfidentialNonce =
         (_func_int **)
         &nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&nonce,"already set to issue parameter","");
    CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)&nonce);
    __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
  }
  iVar8 = Amount::GetSatoshiValue(asset_amount);
  if (iVar8 < 1) {
    iVar8 = Amount::GetSatoshiValue(token_amount);
    if (iVar8 < 1) {
      nonce._vptr_ConfidentialNonce = (_func_int **)0x5893e8;
      nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0x75a;
      nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = "SetAssetIssuance";
      logger::log<>((CfdSourceLocation *)&nonce,kCfdLogLevelWarning,
                    "Issuance must have one non-zero amount.");
      pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
      nonce._vptr_ConfidentialNonce =
           (_func_int **)
           &nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&nonce,"Issuance must have one non-zero amount.","");
      CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)&nonce);
      __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  pAVar1 = (asset_output_amount_list->
           super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pAVar2 = (asset_output_amount_list->
           super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((pAVar1 == pAVar2) ==
      ((asset_locking_script_list->
       super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>)._M_impl.
       super__Vector_impl_data._M_start ==
      (asset_locking_script_list->
      super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>)._M_impl.
      super__Vector_impl_data._M_finish)) {
    if (pAVar1 != pAVar2) {
      Amount::Amount(&total);
      pAVar11 = (asset_output_amount_list->
                super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pAVar3 = (asset_output_amount_list->
               super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (pAVar11 != pAVar3) {
        do {
          Amount::operator+=(&total,pAVar11);
          pAVar11 = pAVar11 + 1;
        } while (pAVar11 != pAVar3);
      }
      bVar17 = Amount::operator!=(&total,asset_amount);
      if (bVar17) {
        nonce._vptr_ConfidentialNonce = (_func_int **)0x5893e8;
        nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = 0x76c;
        nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = "SetAssetIssuance";
        logger::log<>((CfdSourceLocation *)&nonce,kCfdLogLevelWarning,"Unmatch asset amount.");
        pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
        nonce._vptr_ConfidentialNonce =
             (_func_int **)
             &nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&nonce,"Unmatch asset amount.","");
        CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)&nonce);
        __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
      }
      pSVar4 = (asset_locking_script_list->
               super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (pSVar12 = (asset_locking_script_list->
                     super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>).
                     _M_impl.super__Vector_impl_data._M_start; pSVar12 != pSVar4;
          pSVar12 = pSVar12 + 1) {
        bVar17 = Script::IsEmpty(pSVar12);
        if (bVar17) {
          nonce._vptr_ConfidentialNonce = (_func_int **)0x5893e8;
          nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x771;
          nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish = "SetAssetIssuance";
          logger::log<>((CfdSourceLocation *)&nonce,kCfdLogLevelWarning,
                        "Empty locking script from asset.");
          pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
          nonce._vptr_ConfidentialNonce =
               (_func_int **)
               &nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&nonce,"Empty locking script from asset.","");
          CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)&nonce);
          __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
        }
      }
    }
    pAVar1 = (token_output_amount_list->
             super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pAVar2 = (token_output_amount_list->
             super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if ((pAVar1 == pAVar2) !=
        ((token_locking_script_list->
         super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>)._M_impl.
         super__Vector_impl_data._M_start ==
        (token_locking_script_list->
        super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>)._M_impl.
        super__Vector_impl_data._M_finish)) {
      nonce._vptr_ConfidentialNonce = (_func_int **)0x5893e8;
      nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0x779;
      nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = "SetAssetIssuance";
      logger::log<>((CfdSourceLocation *)&nonce,kCfdLogLevelWarning,
                    "Unmatch count. token amount list and locking script list.");
      pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
      nonce._vptr_ConfidentialNonce =
           (_func_int **)
           &nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&nonce,"Unmatch count. token amount list and locking script list.","");
      CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)&nonce);
      __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if (pAVar1 != pAVar2) {
      Amount::Amount(&total);
      pAVar11 = (token_output_amount_list->
                super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pAVar3 = (token_output_amount_list->
               super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (pAVar11 != pAVar3) {
        do {
          Amount::operator+=(&total,pAVar11);
          pAVar11 = pAVar11 + 1;
        } while (pAVar11 != pAVar3);
      }
      bVar17 = Amount::operator!=(&total,token_amount);
      if (bVar17) {
        nonce._vptr_ConfidentialNonce = (_func_int **)0x5893e8;
        nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = 0x785;
        nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = "SetAssetIssuance";
        logger::log<>((CfdSourceLocation *)&nonce,kCfdLogLevelWarning,"Unmatch token amount.");
        pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
        nonce._vptr_ConfidentialNonce =
             (_func_int **)
             &nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&nonce,"Unmatch token amount.","");
        CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)&nonce);
        __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
      }
      pSVar4 = (token_locking_script_list->
               super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (pSVar12 = (token_locking_script_list->
                     super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>).
                     _M_impl.super__Vector_impl_data._M_start; pSVar12 != pSVar4;
          pSVar12 = pSVar12 + 1) {
        bVar17 = Script::IsEmpty(pSVar12);
        if (bVar17) {
          nonce._vptr_ConfidentialNonce = (_func_int **)0x5893e8;
          nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x78a;
          nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish = "SetAssetIssuance";
          logger::log<>((CfdSourceLocation *)&nonce,kCfdLogLevelWarning,
                        "Empty locking script from token.");
          pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
          nonce._vptr_ConfidentialNonce =
               (_func_int **)
               &nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&nonce,"Empty locking script from token.","");
          CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)&nonce);
          __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
        }
      }
    }
    AbstractTxIn::GetTxid
              ((Txid *)&nonce,
               &(this->vin_).
                super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
                ._M_impl.super__Vector_impl_data._M_start[tx_in_index].super_AbstractTxIn);
    vout = AbstractTxIn::GetVout
                     (&(this->vin_).
                       super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
                       ._M_impl.super__Vector_impl_data._M_start[tx_in_index].super_AbstractTxIn);
    ByteData256::ByteData256((ByteData256 *)&total);
    CalculateIssuanceValue
              (__return_storage_ptr__,(Txid *)&nonce,vout,is_blind,contract_hash,
               (ByteData256 *)&total);
    if (total.amount_ != 0) {
      operator_delete((void *)total.amount_);
    }
    nonce._vptr_ConfidentialNonce = (_func_int **)&PTR__Txid_00678d28;
    if ((void *)CONCAT44(nonce.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         nonce.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
      operator_delete((void *)CONCAT44(nonce.data_.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       nonce.data_.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_));
    }
    ByteData256::ByteData256(&local_c8);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_e0.data_,&contract_hash->data_);
    ConfidentialValue::ConfidentialValue(&local_88,asset_amount);
    ConfidentialValue::ConfidentialValue(&local_b0,token_amount);
    ByteData::ByteData(&local_48);
    ByteData::ByteData(&local_60);
    issuance_amount_rangeproof.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)&local_60;
    issuance_amount_rangeproof.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&local_48;
    issuance_amount_rangeproof.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)nonce._vptr_ConfidentialNonce;
    inflation_keys_rangeproof.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ =
         nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
         .super__Vector_impl_data._M_start._4_4_;
    inflation_keys_rangeproof.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ =
         nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
         .super__Vector_impl_data._M_start._0_4_;
    inflation_keys_rangeproof.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
         .super__Vector_impl_data._M_finish;
    inflation_keys_rangeproof.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
         .super__Vector_impl_data._M_end_of_storage;
    SetIssuance(this,tx_in_index,&local_c8,&local_e0,&local_88,&local_b0,issuance_amount_rangeproof,
                inflation_keys_rangeproof);
    if (local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_b0._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_0068d0c0;
    if (local_b0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_88._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_0068d0c0;
    if (local_88.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_e0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e0.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_c8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c8.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((asset_output_amount_list->
        super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
        super__Vector_impl_data._M_start !=
        (asset_output_amount_list->
        super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      iVar8 = Amount::GetSatoshiValue(asset_amount);
      if ((0 < iVar8) &&
         ((asset_output_amount_list->
          super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
          super__Vector_impl_data._M_finish !=
          (asset_output_amount_list->
          super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
          super__Vector_impl_data._M_start)) {
        lVar13 = 0;
        lVar14 = 0;
        lVar16 = 0;
        uVar15 = 0;
        do {
          nonce._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialNonce_0068d410;
          ByteData::ByteData(&nonce.data_);
          nonce.version_ = '\0';
          pCVar5 = (asset_nonce_list->
                   super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((uVar15 < (ulong)(((long)(asset_nonce_list->
                                       super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar5 >>
                                3) * -0x3333333333333333)) &&
             ((ConfidentialNonce *)((long)&pCVar5->_vptr_ConfidentialNonce + lVar16) != &nonce)) {
            ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                      (&nonce.data_.data_,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       ((long)&(pCVar5->data_).data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar16));
            nonce.version_ = (&pCVar5->version_)[lVar16];
          }
          AddTxOut(this,(Amount *)
                        ((long)&((asset_output_amount_list->
                                 super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->amount_ + lVar14),
                   &__return_storage_ptr__->asset,
                   (Script *)
                   ((long)&((asset_locking_script_list->
                            super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>
                            )._M_impl.super__Vector_impl_data._M_start)->_vptr_Script + lVar13),
                   &nonce);
          nonce._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialNonce_0068d410;
          if ((void *)CONCAT44(nonce.data_.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,
                               nonce.data_.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
            operator_delete((void *)CONCAT44(nonce.data_.data_.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                             nonce.data_.data_.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start._0_4_));
          }
          uVar15 = uVar15 + 1;
          lVar16 = lVar16 + 0x28;
          lVar14 = lVar14 + 0x10;
          lVar13 = lVar13 + 0x38;
        } while (uVar15 < (ulong)((long)(asset_output_amount_list->
                                        super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(asset_output_amount_list->
                                        super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
                                        )._M_impl.super__Vector_impl_data._M_start >> 4));
      }
    }
    if ((token_output_amount_list->
        super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
        super__Vector_impl_data._M_start !=
        (token_output_amount_list->
        super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      iVar8 = Amount::GetSatoshiValue(token_amount);
      if ((0 < iVar8) &&
         ((token_output_amount_list->
          super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
          super__Vector_impl_data._M_finish !=
          (token_output_amount_list->
          super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
          super__Vector_impl_data._M_start)) {
        lVar13 = 0;
        lVar14 = 0;
        lVar16 = 0;
        uVar15 = 0;
        do {
          nonce._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialNonce_0068d410;
          ByteData::ByteData(&nonce.data_);
          nonce.version_ = '\0';
          pCVar5 = (token_nonce_list->
                   super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((uVar15 < (ulong)(((long)(token_nonce_list->
                                       super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar5 >>
                                3) * -0x3333333333333333)) &&
             ((ConfidentialNonce *)((long)&pCVar5->_vptr_ConfidentialNonce + lVar16) != &nonce)) {
            ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                      (&nonce.data_.data_,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       ((long)&(pCVar5->data_).data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar16));
            nonce.version_ = (&pCVar5->version_)[lVar16];
          }
          AddTxOut(this,(Amount *)
                        ((long)&((token_output_amount_list->
                                 super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->amount_ + lVar14),
                   &__return_storage_ptr__->token,
                   (Script *)
                   ((long)&((token_locking_script_list->
                            super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>
                            )._M_impl.super__Vector_impl_data._M_start)->_vptr_Script + lVar13),
                   &nonce);
          nonce._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialNonce_0068d410;
          if ((void *)CONCAT44(nonce.data_.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,
                               nonce.data_.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
            operator_delete((void *)CONCAT44(nonce.data_.data_.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                             nonce.data_.data_.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start._0_4_));
          }
          uVar15 = uVar15 + 1;
          lVar16 = lVar16 + 0x28;
          lVar14 = lVar14 + 0x10;
          lVar13 = lVar13 + 0x38;
        } while (uVar15 < (ulong)((long)(token_output_amount_list->
                                        super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(token_output_amount_list->
                                        super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
                                        )._M_impl.super__Vector_impl_data._M_start >> 4));
      }
    }
    return __return_storage_ptr__;
  }
  nonce._vptr_ConfidentialNonce = (_func_int **)0x5893e8;
  nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x760;
  nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "SetAssetIssuance";
  logger::log<>((CfdSourceLocation *)&nonce,kCfdLogLevelWarning,
                "Unmatch count. asset amount list and locking script list.");
  pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
  nonce._vptr_ConfidentialNonce =
       (_func_int **)
       &nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&nonce,"Unmatch count. asset amount list and locking script list.","");
  CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)&nonce);
  __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

IssuanceParameter ConfidentialTransaction::SetAssetIssuance(
    uint32_t tx_in_index, const Amount &asset_amount,
    const std::vector<Amount> &asset_output_amount_list,
    const std::vector<Script> &asset_locking_script_list,
    const std::vector<ConfidentialNonce> &asset_nonce_list,
    const Amount &token_amount,
    const std::vector<Amount> &token_output_amount_list,
    const std::vector<Script> &token_locking_script_list,
    const std::vector<ConfidentialNonce> &token_nonce_list, bool is_blind,
    const ByteData256 &contract_hash) {
  CheckTxInIndex(tx_in_index, __LINE__, __FUNCTION__);

  if ((vin_[tx_in_index].GetInflationKeys().GetData().GetDataSize() > 0) ||
      (vin_[tx_in_index].GetIssuanceAmount().GetData().GetDataSize() > 0)) {
    warn(CFD_LOG_SOURCE, "already set to issue parameter");
    throw CfdException(
        kCfdIllegalArgumentError, "already set to issue parameter");
  }
  if ((asset_amount.GetSatoshiValue() <= 0) &&
      (token_amount.GetSatoshiValue() <= 0)) {
    warn(CFD_LOG_SOURCE, "Issuance must have one non-zero amount.");
    throw CfdException(
        kCfdIllegalArgumentError, "Issuance must have one non-zero amount.");
  }
  if (asset_output_amount_list.empty() != asset_locking_script_list.empty()) {
    warn(
        CFD_LOG_SOURCE,
        "Unmatch count. asset amount list and locking script list.");
    throw CfdException(
        kCfdIllegalArgumentError,
        "Unmatch count. asset amount list and locking script list.");
  }
  if (!asset_output_amount_list.empty()) {
    Amount total;
    for (const auto &amount : asset_output_amount_list) {
      total += amount;
    }
    if (total != asset_amount) {
      warn(CFD_LOG_SOURCE, "Unmatch asset amount.");
      throw CfdException(kCfdIllegalArgumentError, "Unmatch asset amount.");
    }
    for (const auto &script : asset_locking_script_list) {
      if (script.IsEmpty()) {
        warn(CFD_LOG_SOURCE, "Empty locking script from asset.");
        throw CfdException(
            kCfdIllegalArgumentError, "Empty locking script from asset.");
      }
    }
  }
  if (token_output_amount_list.empty() != token_locking_script_list.empty()) {
    warn(
        CFD_LOG_SOURCE,
        "Unmatch count. token amount list and locking script list.");
    throw CfdException(
        kCfdIllegalArgumentError,
        "Unmatch count. token amount list and locking script list.");
  }
  if (!token_output_amount_list.empty()) {
    Amount total;
    for (const auto &amount : token_output_amount_list) {
      total += amount;
    }
    if (total != token_amount) {
      warn(CFD_LOG_SOURCE, "Unmatch token amount.");
      throw CfdException(kCfdIllegalArgumentError, "Unmatch token amount.");
    }
    for (const auto &script : token_locking_script_list) {
      if (script.IsEmpty()) {
        warn(CFD_LOG_SOURCE, "Empty locking script from token.");
        throw CfdException(
            kCfdIllegalArgumentError, "Empty locking script from token.");
      }
    }
  }

  IssuanceParameter param = CalculateIssuanceValue(
      vin_[tx_in_index].GetTxid(), vin_[tx_in_index].GetVout(), is_blind,
      contract_hash, ByteData256());
  SetIssuance(
      tx_in_index, ByteData256(), contract_hash,
      ConfidentialValue(asset_amount), ConfidentialValue(token_amount),
      ByteData(), ByteData());

  if ((!asset_output_amount_list.empty()) &&
      (asset_amount.GetSatoshiValue() > 0)) {
    for (size_t index = 0; index < asset_output_amount_list.size(); ++index) {
      ConfidentialNonce nonce;
      if (index < asset_nonce_list.size()) nonce = asset_nonce_list[index];
      AddTxOut(
          asset_output_amount_list[index], param.asset,
          asset_locking_script_list[index], nonce);
    }
  }
  if ((!token_output_amount_list.empty()) &&
      (token_amount.GetSatoshiValue() > 0)) {
    for (size_t index = 0; index < token_output_amount_list.size(); ++index) {
      ConfidentialNonce nonce;
      if (index < token_nonce_list.size()) nonce = token_nonce_list[index];
      AddTxOut(
          token_output_amount_list[index], param.token,
          token_locking_script_list[index], nonce);
    }
  }

  return param;
}